

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O0

void __thiscall
cmExportFileGenerator::PopulateSourcesInterface
          (cmExportFileGenerator *this,cmTargetExport *tei,PreprocessContext preprocessRule,
          ImportPropertyMap *properties,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *missingTargets)

{
  cmTarget *this_00;
  char *pcVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  bool bVar3;
  char *pcVar4;
  mapped_type *pmVar5;
  ulong uVar6;
  allocator local_139;
  key_type local_138;
  undefined4 local_118;
  allocator local_111;
  string local_110;
  allocator local_e9;
  string local_e8;
  undefined1 local_c8 [8];
  string prepro;
  key_type local_a0;
  allocator local_69;
  string local_68;
  char *local_48;
  char *input;
  char *propName;
  cmTarget *target;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *missingTargets_local;
  ImportPropertyMap *properties_local;
  cmTargetExport *pcStack_18;
  PreprocessContext preprocessRule_local;
  cmTargetExport *tei_local;
  cmExportFileGenerator *this_local;
  
  this_00 = tei->Target;
  propName = (char *)this_00;
  target = (cmTarget *)missingTargets;
  missingTargets_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)properties;
  properties_local._4_4_ = preprocessRule;
  pcStack_18 = tei;
  tei_local = (cmTargetExport *)this;
  if (preprocessRule != InstallInterface) {
    __assert_fail("preprocessRule == cmGeneratorExpression::InstallInterface",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmExportFileGenerator.cxx"
                  ,0x180,
                  "void cmExportFileGenerator::PopulateSourcesInterface(cmTargetExport *, cmGeneratorExpression::PreprocessContext, ImportPropertyMap &, std::vector<std::string> &)"
                 );
  }
  input = "INTERFACE_SOURCES";
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"INTERFACE_SOURCES",&local_69);
  pcVar4 = cmTarget::GetProperty(this_00,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  pvVar2 = missingTargets_local;
  pcVar1 = input;
  if (pcVar4 == (char *)0x0) {
    return;
  }
  local_48 = pcVar4;
  if (*pcVar4 == '\0') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_a0,pcVar1,(allocator *)(prepro.field_2._M_local_buf + 0xf));
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)pvVar2,&local_a0);
    std::__cxx11::string::operator=((string *)pmVar5,"");
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator((allocator<char> *)(prepro.field_2._M_local_buf + 0xf));
    return;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e8,pcVar4,&local_e9);
  cmGeneratorExpression::Preprocess((string *)local_c8,&local_e8,properties_local._4_4_,true);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    ResolveTargetsInGeneratorExpressions
              (this,(string *)local_c8,(cmTarget *)propName,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)target,NoReplaceFreeTargets);
    pcVar4 = propName;
    pcVar1 = input;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_110,pcVar1,&local_111);
    bVar3 = checkInterfaceDirs((string *)local_c8,(cmTarget *)pcVar4,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
    pvVar2 = missingTargets_local;
    pcVar1 = input;
    if (((bVar3 ^ 0xffU) & 1) != 0) {
      local_118 = 1;
      goto LAB_00728c1d;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_138,pcVar1,&local_139);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)pvVar2,&local_138);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)local_c8);
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
  }
  local_118 = 0;
LAB_00728c1d:
  std::__cxx11::string::~string((string *)local_c8);
  return;
}

Assistant:

void cmExportFileGenerator::PopulateSourcesInterface(
                      cmTargetExport *tei,
                      cmGeneratorExpression::PreprocessContext preprocessRule,
                      ImportPropertyMap &properties,
                      std::vector<std::string> &missingTargets)
{
  cmTarget *target = tei->Target;
  assert(preprocessRule == cmGeneratorExpression::InstallInterface);

  const char *propName = "INTERFACE_SOURCES";
  const char *input = target->GetProperty(propName);

  if (!input)
    {
    return;
    }

  if (!*input)
    {
    properties[propName] = "";
    return;
    }

  std::string prepro = cmGeneratorExpression::Preprocess(input,
                                                         preprocessRule,
                                                         true);
  if (!prepro.empty())
    {
    this->ResolveTargetsInGeneratorExpressions(prepro, target,
                                                missingTargets);

    if (!checkInterfaceDirs(prepro, target, propName))
      {
      return;
      }
    properties[propName] = prepro;
    }
}